

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O1

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcBoundingBox>
                 (DB *db,LIST *params,IfcBoundingBox *in)

{
  pointer psVar1;
  size_t sVar2;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_> local_81;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> local_80;
  string local_70 [2];
  
  sVar2 = GenericFill<Assimp::IFC::Schema_2x3::IfcGeometricRepresentationItem>
                    (db,params,&in->super_IfcGeometricRepresentationItem);
  psVar1 = (params->members).
           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0x3f < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1)) {
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = psVar1[sVar2].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar2].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint>_>::
    operator()(&local_81,
               (Lazy<Assimp::IFC::Schema_2x3::IfcCartesianPoint> *)
               &(in->super_IfcGeometricRepresentationItem).field_0x30,&local_80,db);
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = psVar1[sVar2 + 1].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar2 + 1].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<double>::operator()
              ((InternGenericConvert<double> *)&local_81,&in->XDim,&local_80,db);
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = psVar1[sVar2 + 2].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar2 + 2].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<double>::operator()
              ((InternGenericConvert<double> *)&local_81,&in->YDim,&local_80,db);
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    psVar1 = (params->members).
             super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = psVar1[sVar2 + 3].
             super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_80.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         psVar1[sVar2 + 3].
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_80.
         super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_80.
              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    InternGenericConvert<double>::operator()
              ((InternGenericConvert<double> *)&local_81,&in->ZDim,&local_80,db);
    if (local_80.
        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_80.
                 super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    return sVar2 + 4;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  local_70[0]._M_dataplus._M_p = (pointer)&local_70[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"expected 4 arguments to IfcBoundingBox","");
  TypeError::TypeError(this,local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcBoundingBox>(const DB& db, const LIST& params, IfcBoundingBox* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcGeometricRepresentationItem*>(in));
	if (params.GetSize() < 4) { throw STEP::TypeError("expected 4 arguments to IfcBoundingBox"); }    do { // convert the 'Corner' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Corner, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 0 to IfcBoundingBox to be a `IfcCartesianPoint`")); }
    } while(0);
    do { // convert the 'XDim' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->XDim, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 1 to IfcBoundingBox to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'YDim' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->YDim, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 2 to IfcBoundingBox to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
    do { // convert the 'ZDim' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->ZDim, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 3 to IfcBoundingBox to be a `IfcPositiveLengthMeasure`")); }
    } while(0);
	return base;
}